

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteFoldedExprList(WatWriter *this,ExprList *exprs)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer pEVar3;
  pointer pEVar4;
  uint uVar5;
  uint uVar6;
  pointer pEVar7;
  Expr *expr;
  long lVar8;
  long lVar9;
  Arities AVar10;
  ExprTree tree;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  local_88;
  ulong local_68;
  Expr *local_60;
  ExprTree local_58;
  
  expr = exprs->first_;
  if (expr != (Expr *)0x0) {
    do {
      AVar10 = ModuleContext::GetExprArity(&this->super_ModuleContext,expr);
      uVar5 = AVar10.nargs;
      pEVar7 = (this->expr_tree_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = 0;
      pEVar4 = pEVar7;
      if (uVar5 != 0) {
        uVar6 = 0;
        pEVar3 = pEVar7;
        while (pEVar4 = pEVar7,
              pEVar3 != (this->expr_tree_stack_).
                        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
          if (pEVar3[-1].result_count == 0) {
            __assert_fail("iter->result_count > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wat-writer.cc"
                          ,0x402,
                          "void wabt::(anonymous namespace)::WatWriter::PushExpr(const Expr *, Index, Index)"
                         );
          }
          uVar6 = uVar6 + pEVar3[-1].result_count;
          pEVar3 = pEVar3 + -1;
          pEVar4 = pEVar3;
          if ((uVar6 == uVar5) || (pEVar4 = pEVar7, uVar5 < uVar6)) break;
        }
      }
      local_68 = AVar10._0_8_ >> 0x20;
      local_58.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58.result_count = AVar10.nreturns;
      local_60 = expr;
      local_58.expr = expr;
      if ((uVar5 != 0) && (uVar6 == uVar5)) {
        if (0 < (long)pEVar7 - (long)pEVar4) {
          lVar8 = (ulong)((long)pEVar7 - (long)pEVar4) / 0x28 + 1;
          pEVar3 = pEVar4;
          do {
            std::
            vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
            ::emplace_back<wabt::(anonymous_namespace)::ExprTree>(&local_58.children,pEVar3);
            pEVar3 = pEVar3 + 1;
            lVar8 = lVar8 + -1;
          } while (1 < lVar8);
        }
        if (pEVar4 != pEVar7) {
          uVar2 = (long)(this->expr_tree_stack_).
                        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar7;
          if ((uVar2 != 0) && (0 < (long)uVar2)) {
            lVar9 = uVar2 / 0x28 + 1;
            lVar8 = 0;
            do {
              *(undefined8 *)((long)&pEVar4->expr + lVar8) =
                   *(undefined8 *)((long)&pEVar7->expr + lVar8);
              local_88.
              super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   *(pointer *)
                    ((long)&(pEVar4->children).
                            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar8);
              local_88.
              super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   *(pointer *)
                    ((long)&(pEVar4->children).
                            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                            ._M_impl.super__Vector_impl_data._M_finish + lVar8);
              local_88.
              super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)
                    ((long)&(pEVar4->children).
                            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar8);
              *(undefined8 *)
               ((long)&(pEVar4->children).
                       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar8) =
                   *(undefined8 *)
                    ((long)&(pEVar7->children).
                            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar8);
              *(undefined8 *)
               ((long)&(pEVar4->children).
                       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                       ._M_impl.super__Vector_impl_data._M_finish + lVar8) =
                   *(undefined8 *)
                    ((long)&(pEVar7->children).
                            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                            ._M_impl.super__Vector_impl_data._M_finish + lVar8);
              *(undefined8 *)
               ((long)&(pEVar4->children).
                       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar8) =
                   *(undefined8 *)
                    ((long)&(pEVar7->children).
                            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar8);
              *(pointer *)
               ((long)&(pEVar7->children).
                       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar8) =
                   local_88.
                   super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              *(pointer *)
               ((long)&(pEVar7->children).
                       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                       ._M_impl.super__Vector_impl_data._M_finish + lVar8) =
                   local_88.
                   super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              *(pointer *)
               ((long)&(pEVar7->children).
                       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar8) =
                   local_88.
                   super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)
                       ((long)&(pEVar7->children).
                               super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar8);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined8 *)
               ((long)&(pEVar7->children).
                       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar8) = 0;
              std::
              vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ::~vector(&local_88);
              *(undefined4 *)((long)&pEVar4->result_count + lVar8) =
                   *(undefined4 *)((long)&pEVar7->result_count + lVar8);
              lVar9 = lVar9 + -1;
              lVar8 = lVar8 + 0x28;
            } while (1 < lVar9);
          }
          pEVar3 = (this->expr_tree_stack_).
                   super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pEVar4 = (pointer)((long)pEVar4 + ((long)pEVar3 - (long)pEVar7));
          pEVar7 = pEVar4;
          if (pEVar3 != pEVar4) {
            do {
              std::
              vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              ::~vector(&pEVar7->children);
              pEVar7 = pEVar7 + 1;
            } while (pEVar7 != pEVar3);
            (this->expr_tree_stack_).
            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
            ._M_impl.super__Vector_impl_data._M_finish = pEVar4;
          }
        }
      }
      std::
      vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ::emplace_back<wabt::(anonymous_namespace)::ExprTree>(&this->expr_tree_stack_,&local_58);
      if ((local_68 == 0) || (uVar5 < uVar6)) {
        FlushExprTreeStack(this);
      }
      std::
      vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ::~vector(&local_58.children);
      expr = (local_60->super_intrusive_list_base<wabt::Expr>).next_;
    } while (expr != (Expr *)0x0);
  }
  return;
}

Assistant:

void WatWriter::WriteFoldedExprList(const ExprList& exprs) {
  WABT_TRACE(WriteFoldedExprList);
  for (const Expr& expr : exprs) {
    WriteFoldedExpr(&expr);
  }
}